

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.c
# Opt level: O1

int wally_ec_public_key_from_private_key
              (uchar *priv_key,size_t priv_key_len,uchar *bytes_out,size_t len)

{
  int iVar1;
  secp256k1_context_struct *ctx;
  bool bVar2;
  bool bVar3;
  size_t len_in_out;
  secp256k1_pubkey pub;
  size_t local_70;
  secp256k1_pubkey local_68;
  
  local_70 = 0x21;
  ctx = secp_ctx();
  if (ctx != (secp256k1_context_struct *)0x0) {
    bVar2 = false;
    bVar3 = false;
    if ((((bytes_out != (uchar *)0x0) && (bVar3 = bVar2, priv_key != (uchar *)0x0)) &&
        (priv_key_len == 0x20)) && (len == 0x21)) {
      iVar1 = secp256k1_ec_pubkey_create(ctx,&local_68,priv_key);
      if ((iVar1 == 0) ||
         (iVar1 = pubkey_serialize(bytes_out,&local_70,&local_68,0x102), iVar1 == 0)) {
        bVar3 = false;
      }
      else {
        bVar3 = local_70 == 0x21;
      }
    }
    if (bytes_out != (uchar *)0x0 && bVar3 == false) {
      wally_clear(bytes_out,len);
    }
    wally_clear(&local_68,0x40);
    return (uint)bVar3 * 2 + -2;
  }
  return -3;
}

Assistant:

int wally_ec_public_key_from_private_key(const unsigned char *priv_key, size_t priv_key_len,
                                         unsigned char *bytes_out, size_t len)
{
    secp256k1_pubkey pub;
    size_t len_in_out = EC_PUBLIC_KEY_LEN;
    const secp256k1_context *ctx = secp_ctx();
    bool ok;

    if (!ctx)
        return WALLY_ENOMEM;

    ok = priv_key && priv_key_len == EC_PRIVATE_KEY_LEN &&
         bytes_out && len == EC_PUBLIC_KEY_LEN &&
         pubkey_create(ctx, &pub, priv_key) &&
         pubkey_serialize(bytes_out, &len_in_out, &pub, PUBKEY_COMPRESSED) &&
         len_in_out == EC_PUBLIC_KEY_LEN;

    if (!ok && bytes_out)
        wally_clear(bytes_out, len);
    wally_clear(&pub, sizeof(pub));
    return ok ? WALLY_OK : WALLY_EINVAL;
}